

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O3

SidTreeNode * __thiscall
COLLADASaxFWL::DocumentProcessor::resolveSidInInstance
          (DocumentProcessor *this,SidTreeNode *instancingElement,SidAddress *sidAddress,
          size_t firstSidIndex)

{
  Animatable *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SidTreeNode *pSVar3;
  Animatable *pAVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined1 auStack_a8 [104];
  size_t local_40;
  size_t sStack_38;
  
  if (instancingElement->mTargetType == TARGETTYPECLASS_INTERMEDIATETARGETABLE) {
    pAVar1 = (instancingElement->mTarget).animatable;
    iVar2 = (*pAVar1->_vptr_Animatable[2])(pAVar1);
    if (CONCAT44(extraout_var,iVar2) == 1) {
      iVar2 = (*pAVar1->_vptr_Animatable[2])(pAVar1);
      pAVar4 = (Animatable *)0x0;
      if (CONCAT44(extraout_var_00,iVar2) == 1) {
        pAVar4 = pAVar1;
      }
      SidAddress::SidAddress((SidAddress *)auStack_a8,(URI *)&pAVar4->mAnimationList);
      uVar5 = (long)(sidAddress->mSids).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(sidAddress->mSids).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar6 = uVar5 - firstSidIndex;
      if (firstSidIndex <= uVar5 && lVar6 != 0) {
        lVar7 = firstSidIndex << 5;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(auStack_a8 + 0x28),
                      (value_type *)
                      ((long)&(((sidAddress->mSids).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar7));
          lVar7 = lVar7 + 0x20;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      local_40 = sidAddress->mFirstIndex;
      sStack_38 = sidAddress->mSecondIndex;
      auStack_a8._64_4_ = sidAddress->mMemberSelection;
      std::__cxx11::string::_M_assign((string *)(auStack_a8 + 0x48));
      pSVar3 = resolveSid(this,(SidAddress *)auStack_a8);
      SidAddress::~SidAddress((SidAddress *)auStack_a8);
      return pSVar3;
    }
  }
  return (SidTreeNode *)0x0;
}

Assistant:

const SidTreeNode* DocumentProcessor::resolveSidInInstance( const SidTreeNode* instancingElement, const SidAddress& sidAddress,  size_t firstSidIndex)
	{
		// the sid address we use to resolve the sid in the instantiated element
		const COLLADABU::URI* uri = 0;

		//check if instancingElement instantiates an element
		switch ( instancingElement->getTargetType() )
		{
		case SidTreeNode::TARGETTYPECLASS_INTERMEDIATETARGETABLE:
			{
				IntermediateTargetable* iTargetable = instancingElement->getIntermediateTargetableTarget();
				switch ( iTargetable->getClassId() )
				{
				case INTERMEDIATETARGETABLE_TYPE::KINEMATICS_INSTANCE:
					{
						KinematicInstance* ki = intermediateTargetableSafeCast<KinematicInstance>(iTargetable);
						uri = &ki->getUrl();
						break;
					}
				}

			}
			// 		case SidTreeNode::TARGETTYPECLASS_OBJECT:
			// 			{
			// 				COLLADAFW::Object* iObject = instancingElement->getObjectTarget();
			// 				switch ( iObject->getClassId() )
			// 				{
			// 				case COLLADAFW::COLLADA_TYPE::JOINT:
			// 					{
			// 						KinematicInstance* ki = (KinematicInstance*) iObject;
			// 						uri = &ki->getUrl();
			// 					}
			// 				}
			// 			}
        default:
            break;
		}

		if ( !uri )
		{
			// we could not find an instantiated element
			return 0;
		}

		SidAddress newSidAddress( *uri );
		const SidAddress::SidList& allSids = sidAddress.getSids();
		size_t allSidsCount = allSids.size();
		for ( size_t i = firstSidIndex; i < allSidsCount; ++i)
		{
			newSidAddress.appendSid( allSids[i] );
		}	
		newSidAddress.setFirstIndex( sidAddress.getFirstIndex() );
		newSidAddress.setSecondIndex( sidAddress.getSecondIndex() );
		newSidAddress.setMemberSelection( sidAddress.getMemberSelection() );
		newSidAddress.setMemberSelectionName( sidAddress.getMemberSelectionName() );
		return resolveSid( newSidAddress );
	}